

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

ON_Xform *
ON_Texture::GetPictureShrinkSurfaceTransformation
          (ON_Xform *__return_storage_ptr__,ON_Brep *original,ON_Brep *shrunk,ON_Xform *error_return
          )

{
  int iVar1;
  ON_BrepFace *pOVar2;
  ON_Surface *local_50;
  ON_Surface *local_48;
  ON_Surface *shrunk_srf;
  ON_Surface *original_srf;
  ON_Xform *error_return_local;
  ON_Brep *shrunk_local;
  ON_Brep *original_local;
  
  if (original == (ON_Brep *)0x0) {
LAB_006c448f:
    local_48 = (ON_Surface *)0x0;
  }
  else {
    iVar1 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&original->m_F);
    if (iVar1 != 1) goto LAB_006c448f;
    pOVar2 = ON_ClassArray<ON_BrepFace>::operator[]((ON_ClassArray<ON_BrepFace> *)&original->m_F,0);
    local_48 = ON_BrepFace::SurfaceOf(pOVar2);
  }
  if (shrunk != (ON_Brep *)0x0) {
    iVar1 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&shrunk->m_F);
    if (iVar1 == 1) {
      pOVar2 = ON_ClassArray<ON_BrepFace>::operator[]((ON_ClassArray<ON_BrepFace> *)&shrunk->m_F,0);
      local_50 = ON_BrepFace::SurfaceOf(pOVar2);
      goto LAB_006c44ea;
    }
  }
  local_50 = (ON_Surface *)0x0;
LAB_006c44ea:
  GetPictureShrinkSurfaceTransformation(__return_storage_ptr__,local_48,local_50,error_return);
  return __return_storage_ptr__;
}

Assistant:

ON_Xform ON_Texture::GetPictureShrinkSurfaceTransformation(
  const class ON_Brep* original,
  const class ON_Brep* shrunk,
  const ON_Xform* error_return
)
{
  const class ON_Surface* original_srf
    = (nullptr != original && 1 == original->m_F.Count())
    ? original->m_F[0].SurfaceOf()
    : nullptr;
  const class ON_Surface* shrunk_srf
    = (nullptr != shrunk && 1 == shrunk->m_F.Count())
    ? shrunk->m_F[0].SurfaceOf()
    : nullptr;
  return ON_Texture::GetPictureShrinkSurfaceTransformation(
    original_srf,
    shrunk_srf,
    error_return
  );
}